

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O0

void __thiscall intel_acm_t::header_t::~header_t(header_t *this)

{
  header_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__header_t_00270bf0;
  _clean_up(this);
  std::__cxx11::string::~string((string *)&this->m_scratch_space);
  std::__cxx11::string::~string((string *)&this->m_rsa_signature);
  std::__cxx11::string::~string((string *)&this->m_rsa_public_key);
  std::__cxx11::string::~string((string *)&this->m_reserved);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

intel_acm_t::header_t::~header_t() {
    _clean_up();
}